

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [12];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar23;
  uint uVar24;
  long lVar25;
  byte bVar26;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar27) [32];
  byte bVar28;
  ulong uVar29;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar72;
  undefined1 auVar73 [64];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined4 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  vfloat4 a0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  long lStack_2580;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int iVar36;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar41 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar18 = ZEXT812(0) << 0x20;
    auVar39 = ZEXT816(0) << 0x40;
    auVar78._4_12_ = auVar18;
    auVar78._0_4_ = auVar41._0_4_;
    auVar37 = vrsqrt14ss_avx512f(auVar39,auVar78);
    fVar77 = auVar37._0_4_;
    pre.depth_scale = fVar77 * 1.5 - auVar41._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar77 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar89._0_4_ = aVar6.x * pre.depth_scale;
    auVar89._4_4_ = aVar6.y * pre.depth_scale;
    auVar89._8_4_ = aVar6.z * pre.depth_scale;
    auVar89._12_4_ = aVar6.field_3.w * pre.depth_scale;
    auVar37 = vshufpd_avx(auVar89,auVar89,1);
    auVar41 = vmovshdup_avx(auVar89);
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    auVar49._16_4_ = 0x80000000;
    auVar49._0_16_ = auVar75;
    auVar49._20_4_ = 0x80000000;
    auVar49._24_4_ = 0x80000000;
    auVar49._28_4_ = 0x80000000;
    auVar92._0_4_ = auVar41._0_4_ ^ 0x80000000;
    auVar41 = vunpckhps_avx(auVar89,auVar39);
    auVar92._4_12_ = auVar18;
    auVar40 = vshufps_avx(auVar41,auVar92,0x41);
    auVar41 = vdpps_avx(auVar40,auVar40,0x7f);
    auVar91._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
    auVar91._8_8_ = auVar37._8_8_ ^ auVar75._8_8_;
    auVar38 = vinsertps_avx(auVar91,auVar89,0x2a);
    auVar37 = vdpps_avx(auVar38,auVar38,0x7f);
    uVar12 = vcmpps_avx512vl(auVar37,auVar41,1);
    auVar41 = vpmovm2d_avx512vl(uVar12);
    auVar96._0_4_ = auVar41._0_4_;
    auVar96._4_4_ = auVar96._0_4_;
    auVar96._8_4_ = auVar96._0_4_;
    auVar96._12_4_ = auVar96._0_4_;
    uVar34 = vpmovd2m_avx512vl(auVar96);
    auVar41 = vpcmpeqd_avx(auVar96,auVar96);
    auVar37._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar41._4_4_;
    auVar37._0_4_ = (uint)((byte)uVar34 & 1) * auVar41._0_4_;
    auVar37._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar41._8_4_;
    auVar37._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar41._12_4_;
    auVar41 = vblendvps_avx(auVar38,auVar40,auVar37);
    auVar37 = vdpps_avx(auVar41,auVar41,0x7f);
    auVar79._4_12_ = auVar18;
    auVar79._0_4_ = auVar37._0_4_;
    auVar38 = vrsqrt14ss_avx512f(auVar39,auVar79);
    fVar72 = auVar38._0_4_;
    fVar72 = fVar72 * 1.5 - auVar37._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
    auVar80._0_4_ = auVar41._0_4_ * fVar72;
    auVar80._4_4_ = auVar41._4_4_ * fVar72;
    auVar80._8_4_ = auVar41._8_4_ * fVar72;
    auVar80._12_4_ = auVar41._12_4_ * fVar72;
    auVar41 = vshufps_avx(auVar80,auVar80,0xc9);
    auVar37 = vshufps_avx(auVar89,auVar89,0xc9);
    auVar93._0_4_ = auVar37._0_4_ * auVar80._0_4_;
    auVar93._4_4_ = auVar37._4_4_ * auVar80._4_4_;
    auVar93._8_4_ = auVar37._8_4_ * auVar80._8_4_;
    auVar93._12_4_ = auVar37._12_4_ * auVar80._12_4_;
    auVar41 = vfmsub231ps_fma(auVar93,auVar89,auVar41);
    auVar37 = vshufps_avx(auVar41,auVar41,0xc9);
    auVar41 = vdpps_avx(auVar37,auVar37,0x7f);
    auVar97._4_12_ = auVar18;
    auVar97._0_4_ = auVar41._0_4_;
    auVar38 = vrsqrt14ss_avx512f(auVar39,auVar97);
    fVar72 = auVar38._0_4_;
    fVar72 = fVar72 * 1.5 - fVar72 * fVar72 * fVar72 * auVar41._0_4_ * 0.5;
    auVar84._0_4_ = auVar37._0_4_ * fVar72;
    auVar84._4_4_ = auVar37._4_4_ * fVar72;
    auVar84._8_4_ = auVar37._8_4_ * fVar72;
    auVar84._12_4_ = auVar37._12_4_ * fVar72;
    auVar41._0_4_ = pre.depth_scale * auVar89._0_4_;
    auVar41._4_4_ = pre.depth_scale * auVar89._4_4_;
    auVar41._8_4_ = pre.depth_scale * auVar89._8_4_;
    auVar41._12_4_ = pre.depth_scale * auVar89._12_4_;
    auVar38 = vunpcklps_avx(auVar80,auVar41);
    auVar41 = vunpckhps_avx(auVar80,auVar41);
    auVar40 = vunpcklps_avx(auVar84,auVar39);
    auVar37 = vunpckhps_avx(auVar84,auVar39);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar41,auVar37)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar38,auVar40)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar38,auVar40)
    ;
    pSVar30 = stack + 1;
    stack[0].dist = 0;
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar38._8_4_ = 0x7fffffff;
    auVar38._0_8_ = 0x7fffffff7fffffff;
    auVar38._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl((undefined1  [16])aVar6,auVar38);
    auVar85._8_4_ = 0x219392ef;
    auVar85._0_8_ = 0x219392ef219392ef;
    auVar85._12_4_ = 0x219392ef;
    uVar34 = vcmpps_avx512vl(auVar38,auVar85,1);
    bVar33 = (bool)((byte)uVar34 & 1);
    auVar39._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar6.x;
    bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar39._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar6.y;
    bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar39._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * (int)aVar6.z;
    bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar39._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * aVar6.field_3.a;
    auVar38 = vrcp14ps_avx512vl(auVar39);
    auVar40._8_4_ = 0x3f800000;
    auVar40._0_8_ = 0x3f8000003f800000;
    auVar40._12_4_ = 0x3f800000;
    auVar40 = vfnmadd213ps_avx512vl(auVar39,auVar38,auVar40);
    auVar39 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar42 = vbroadcastss_avx512vl(auVar39);
    auVar38 = vmovshdup_avx(auVar39);
    auVar43 = vbroadcastsd_avx512vl(auVar38);
    auVar40 = vshufpd_avx(auVar39,auVar39,1);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar44 = vpermps_avx512vl(auVar45,ZEXT1632(auVar39));
    fVar72 = auVar39._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar46._4_4_ = fVar72;
    auVar46._0_4_ = fVar72;
    auVar46._8_4_ = fVar72;
    auVar46._12_4_ = fVar72;
    auVar46._16_4_ = fVar72;
    auVar46._20_4_ = fVar72;
    auVar46._24_4_ = fVar72;
    auVar46._28_4_ = fVar72;
    auVar47._8_4_ = 1;
    auVar47._0_8_ = 0x100000001;
    auVar47._12_4_ = 1;
    auVar47._16_4_ = 1;
    auVar47._20_4_ = 1;
    auVar47._24_4_ = 1;
    auVar47._28_4_ = 1;
    auVar48 = ZEXT1632(CONCAT412(auVar39._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar39._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar39._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar72))
                                ));
    auVar47 = vpermps_avx2(auVar47,auVar48);
    auVar95 = ZEXT3264(auVar47);
    auVar48 = vpermps_avx2(auVar45,auVar48);
    auVar90 = ZEXT3264(auVar48);
    uVar34 = (ulong)(auVar39._0_4_ < 0.0);
    uVar32 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    uVar31 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
    uVar29 = uVar34 * 0x20 ^ 0x20;
    auVar45 = vbroadcastss_avx512vl(auVar41);
    uVar83 = auVar37._0_4_;
    auVar73 = ZEXT3264(CONCAT428(uVar83,CONCAT424(uVar83,CONCAT420(uVar83,CONCAT416(uVar83,CONCAT412
                                                  (uVar83,CONCAT48(uVar83,CONCAT44(uVar83,uVar83))))
                                                  ))));
    auVar46 = vxorps_avx512vl(auVar46,auVar49);
    auVar47 = vxorps_avx512vl(auVar47,auVar49);
    auVar48 = vxorps_avx512vl(auVar48,auVar49);
    auVar49 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar98 = ZEXT3264(auVar49);
    auVar49 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar99 = ZEXT3264(auVar49);
LAB_01c534d4:
    if (pSVar30 != stack) {
      pSVar23 = pSVar30 + -1;
      pSVar30 = pSVar30 + -1;
      if ((float)pSVar23->dist <= (ray->super_RayK<1>).tfar) {
        uVar35 = (pSVar30->ptr).ptr;
LAB_01c534f0:
        do {
          fVar72 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar76._4_4_ = fVar72;
          auVar76._0_4_ = fVar72;
          auVar76._8_4_ = fVar72;
          auVar76._12_4_ = fVar72;
          auVar62._16_4_ = fVar72;
          auVar62._0_16_ = auVar76;
          auVar62._20_4_ = fVar72;
          auVar62._24_4_ = fVar72;
          auVar62._28_4_ = fVar72;
          auVar41 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar76);
          fVar74 = auVar41._0_4_;
          auVar61._4_4_ = fVar74;
          auVar61._0_4_ = fVar74;
          auVar61._8_4_ = fVar74;
          auVar61._12_4_ = fVar74;
          auVar61._16_4_ = fVar74;
          auVar61._20_4_ = fVar74;
          auVar61._24_4_ = fVar74;
          auVar61._28_4_ = fVar74;
          do {
            if ((uVar35 & 8) != 0) {
              auVar90 = ZEXT1664(auVar90._0_16_);
              auVar95 = ZEXT1664(auVar95._0_16_);
              (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(uVar35 & 0xfffffffffffffff0) * 0x40))(&pre,ray,context);
              auVar49 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
              auVar99 = ZEXT3264(auVar49);
              auVar49 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
              auVar98 = ZEXT3264(auVar49);
              fVar72 = (ray->super_RayK<1>).tfar;
              auVar73 = ZEXT3264(CONCAT428(fVar72,CONCAT424(fVar72,CONCAT420(fVar72,CONCAT416(fVar72
                                                  ,CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(fVar72,
                                                  fVar72))))))));
              goto LAB_01c534d4;
            }
            uVar24 = (uint)uVar35 & 7;
            pauVar27 = (undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0);
            if (uVar24 == 3) {
              auVar49 = pauVar27[3];
              auVar51 = pauVar27[4];
              auVar50 = pauVar27[5];
              auVar52 = pauVar27[7];
              auVar53 = pauVar27[8];
              auVar64 = pauVar27[9];
              auVar63 = pauVar27[10];
              auVar82._0_4_ = fVar77 * auVar53._0_4_;
              auVar82._4_4_ = fVar77 * auVar53._4_4_;
              auVar82._8_4_ = fVar77 * auVar53._8_4_;
              auVar82._12_4_ = fVar77 * auVar53._12_4_;
              auVar82._16_4_ = fVar77 * auVar53._16_4_;
              auVar82._20_4_ = fVar77 * auVar53._20_4_;
              auVar82._28_36_ = auVar95._28_36_;
              auVar82._24_4_ = fVar77 * auVar53._24_4_;
              auVar95._0_4_ = fVar77 * auVar64._0_4_;
              auVar95._4_4_ = fVar77 * auVar64._4_4_;
              auVar95._8_4_ = fVar77 * auVar64._8_4_;
              auVar95._12_4_ = fVar77 * auVar64._12_4_;
              auVar95._16_4_ = fVar77 * auVar64._16_4_;
              auVar95._20_4_ = fVar77 * auVar64._20_4_;
              auVar95._28_36_ = auVar90._28_36_;
              auVar95._24_4_ = fVar77 * auVar64._24_4_;
              auVar55._4_4_ = fVar77 * auVar63._4_4_;
              auVar55._0_4_ = fVar77 * auVar63._0_4_;
              auVar55._8_4_ = fVar77 * auVar63._8_4_;
              auVar55._12_4_ = fVar77 * auVar63._12_4_;
              auVar55._16_4_ = fVar77 * auVar63._16_4_;
              auVar55._20_4_ = fVar77 * auVar63._20_4_;
              auVar55._24_4_ = fVar77 * auVar63._24_4_;
              auVar55._28_4_ = fVar77;
              auVar21._4_4_ = uVar2;
              auVar21._0_4_ = uVar2;
              auVar21._8_4_ = uVar2;
              auVar21._12_4_ = uVar2;
              auVar21._16_4_ = uVar2;
              auVar21._20_4_ = uVar2;
              auVar21._24_4_ = uVar2;
              auVar21._28_4_ = uVar2;
              auVar41 = vfmadd231ps_fma(auVar82._0_32_,auVar21,auVar50);
              auVar37 = vfmadd231ps_fma(auVar95._0_32_,auVar21,pauVar27[6]);
              auVar38 = vfmadd231ps_fma(auVar55,auVar21,auVar52);
              auVar22._4_4_ = uVar1;
              auVar22._0_4_ = uVar1;
              auVar22._8_4_ = uVar1;
              auVar22._12_4_ = uVar1;
              auVar22._16_4_ = uVar1;
              auVar22._20_4_ = uVar1;
              auVar22._24_4_ = uVar1;
              auVar22._28_4_ = uVar1;
              auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar22,pauVar27[2]);
              auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar22,auVar49);
              auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar22,auVar51);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(ZEXT1632(auVar41),auVar55);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar35 = vcmpps_avx512vl(auVar55,auVar56,1);
              bVar33 = (bool)((byte)uVar35 & 1);
              iVar36 = auVar56._0_4_;
              auVar57._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar41._0_4_;
              bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
              iVar65 = auVar56._4_4_;
              auVar57._4_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar41._4_4_;
              bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
              iVar66 = auVar56._8_4_;
              auVar57._8_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar41._8_4_;
              bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
              iVar67 = auVar56._12_4_;
              auVar57._12_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar41._12_4_;
              iVar68 = auVar56._16_4_;
              auVar57._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar68;
              iVar69 = auVar56._20_4_;
              auVar57._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar69;
              iVar70 = auVar56._24_4_;
              iVar71 = auVar56._28_4_;
              auVar57._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar70;
              auVar57._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar71;
              vandps_avx512vl(ZEXT1632(auVar37),auVar55);
              uVar35 = vcmpps_avx512vl(auVar57,auVar56,1);
              bVar33 = (bool)((byte)uVar35 & 1);
              auVar58._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar37._0_4_;
              bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
              auVar58._4_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar37._4_4_;
              bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
              auVar58._8_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar37._8_4_;
              bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
              auVar58._12_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar37._12_4_;
              auVar58._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar68;
              auVar58._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar69;
              auVar58._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar70;
              auVar58._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar71;
              vandps_avx512vl(ZEXT1632(auVar38),auVar55);
              uVar35 = vcmpps_avx512vl(auVar58,auVar56,1);
              bVar33 = (bool)((byte)uVar35 & 1);
              auVar59._0_4_ = (uint)bVar33 * iVar36 | (uint)!bVar33 * auVar38._0_4_;
              bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
              auVar59._4_4_ = (uint)bVar33 * iVar65 | (uint)!bVar33 * auVar38._4_4_;
              bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
              auVar59._8_4_ = (uint)bVar33 * iVar66 | (uint)!bVar33 * auVar38._8_4_;
              bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
              auVar59._12_4_ = (uint)bVar33 * iVar67 | (uint)!bVar33 * auVar38._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar68;
              auVar59._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar69;
              auVar59._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar70;
              auVar59._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar71;
              auVar55 = vrcp14ps_avx512vl(auVar57);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar60 = vfnmadd213ps_avx512vl(auVar57,auVar55,auVar56);
              auVar41 = vfmadd132ps_fma(auVar60,auVar55,auVar55);
              auVar55 = vrcp14ps_avx512vl(auVar58);
              auVar60 = vfnmadd213ps_avx512vl(auVar58,auVar55,auVar56);
              auVar37 = vfmadd132ps_fma(auVar60,auVar55,auVar55);
              auVar55 = vrcp14ps_avx512vl(auVar59);
              auVar56 = vfnmadd213ps_avx512vl(auVar59,auVar55,auVar56);
              auVar19._4_4_ = uVar5;
              auVar19._0_4_ = uVar5;
              auVar19._8_4_ = uVar5;
              auVar19._12_4_ = uVar5;
              auVar19._16_4_ = uVar5;
              auVar19._20_4_ = uVar5;
              auVar19._24_4_ = uVar5;
              auVar19._28_4_ = uVar5;
              auVar53 = vfmadd213ps_avx512vl(auVar53,auVar19,pauVar27[0xb]);
              auVar38 = vfmadd132ps_fma(auVar56,auVar55,auVar55);
              auVar20._4_4_ = uVar4;
              auVar20._0_4_ = uVar4;
              auVar20._8_4_ = uVar4;
              auVar20._12_4_ = uVar4;
              auVar20._16_4_ = uVar4;
              auVar20._20_4_ = uVar4;
              auVar20._24_4_ = uVar4;
              auVar20._28_4_ = uVar4;
              auVar40 = vfmadd231ps_fma(auVar53,auVar20,auVar50);
              auVar53._4_4_ = fVar72 * *(float *)(pauVar27[0xe] + 4);
              auVar53._0_4_ = fVar72 * *(float *)pauVar27[0xe];
              auVar53._8_4_ = fVar72 * *(float *)(pauVar27[0xe] + 8);
              auVar53._12_4_ = fVar72 * *(float *)(pauVar27[0xe] + 0xc);
              auVar53._16_4_ = fVar72 * *(float *)(pauVar27[0xe] + 0x10);
              auVar53._20_4_ = fVar72 * *(float *)(pauVar27[0xe] + 0x14);
              auVar53._24_4_ = fVar72 * *(float *)(pauVar27[0xe] + 0x18);
              auVar53._28_4_ = auVar50._28_4_;
              auVar50 = vfmadd213ps_avx512vl(auVar64,auVar19,pauVar27[0xc]);
              auVar39 = vfmadd231ps_fma(auVar50,auVar20,pauVar27[6]);
              auVar50 = vfmadd213ps_avx512vl(auVar63,auVar19,pauVar27[0xd]);
              auVar75 = vfmadd231ps_fma(auVar50,auVar20,auVar52);
              auVar50._4_4_ = fVar72 * *(float *)(pauVar27[0xf] + 4);
              auVar50._0_4_ = fVar72 * *(float *)pauVar27[0xf];
              auVar50._8_4_ = fVar72 * *(float *)(pauVar27[0xf] + 8);
              auVar50._12_4_ = fVar72 * *(float *)(pauVar27[0xf] + 0xc);
              auVar50._16_4_ = fVar72 * *(float *)(pauVar27[0xf] + 0x10);
              auVar50._20_4_ = fVar72 * *(float *)(pauVar27[0xf] + 0x14);
              auVar50._24_4_ = fVar72 * *(float *)(pauVar27[0xf] + 0x18);
              auVar50._28_4_ = auVar52._28_4_;
              auVar64._4_4_ = uVar3;
              auVar64._0_4_ = uVar3;
              auVar64._8_4_ = uVar3;
              auVar64._12_4_ = uVar3;
              auVar64._16_4_ = uVar3;
              auVar64._20_4_ = uVar3;
              auVar64._24_4_ = uVar3;
              auVar64._28_4_ = uVar3;
              auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar64,pauVar27[2]);
              auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar64,auVar49);
              auVar52._4_4_ = fVar72 * *(float *)(pauVar27[0x10] + 4);
              auVar52._0_4_ = fVar72 * *(float *)pauVar27[0x10];
              auVar52._8_4_ = fVar72 * *(float *)(pauVar27[0x10] + 8);
              auVar52._12_4_ = fVar72 * *(float *)(pauVar27[0x10] + 0xc);
              auVar52._16_4_ = fVar72 * *(float *)(pauVar27[0x10] + 0x10);
              auVar52._20_4_ = fVar72 * *(float *)(pauVar27[0x10] + 0x14);
              auVar52._24_4_ = fVar72 * *(float *)(pauVar27[0x10] + 0x18);
              auVar52._28_4_ = auVar49._28_4_;
              auVar78 = vfmadd231ps_fma(auVar53,auVar61,ZEXT832(0) << 0x20);
              auVar79 = vfmadd231ps_fma(auVar50,auVar61,ZEXT832(0) << 0x20);
              auVar80 = vfmadd231ps_fma(auVar52,auVar61,ZEXT832(0) << 0x20);
              auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar64,auVar51);
              auVar86._0_4_ = fVar74 + fVar72 * *(float *)pauVar27[0x11];
              auVar86._4_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 4);
              auVar86._8_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 8);
              auVar86._12_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 0xc);
              auVar86._16_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 0x10);
              auVar86._20_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 0x14);
              auVar86._24_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x11] + 0x18);
              auVar86._28_4_ = fVar74 + auVar51._28_4_;
              auVar49 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar40));
              auVar51 = vsubps_avx(auVar86,ZEXT1632(auVar40));
              auVar87._0_4_ = fVar74 + fVar72 * *(float *)pauVar27[0x12];
              auVar87._4_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 4);
              auVar87._8_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 8);
              auVar87._12_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 0xc);
              auVar87._16_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 0x10);
              auVar87._20_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 0x14);
              auVar87._24_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x12] + 0x18);
              auVar87._28_4_ = fVar74 + auVar86._28_4_;
              auVar50 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar39));
              auVar52 = vsubps_avx(auVar87,ZEXT1632(auVar39));
              auVar88._0_4_ = fVar74 + fVar72 * *(float *)pauVar27[0x13];
              auVar88._4_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 4);
              auVar88._8_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 8);
              auVar88._12_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 0xc);
              auVar88._16_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 0x10);
              auVar88._20_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 0x14);
              auVar88._24_4_ = fVar74 + fVar72 * *(float *)(pauVar27[0x13] + 0x18);
              auVar88._28_4_ = fVar74 + auVar87._28_4_;
              auVar53 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar75));
              auVar64 = vsubps_avx(auVar88,ZEXT1632(auVar75));
              auVar63._4_4_ = auVar49._4_4_ * auVar41._4_4_;
              auVar63._0_4_ = auVar49._0_4_ * auVar41._0_4_;
              auVar63._8_4_ = auVar49._8_4_ * auVar41._8_4_;
              auVar63._12_4_ = auVar49._12_4_ * auVar41._12_4_;
              auVar63._16_4_ = auVar49._16_4_ * 0.0;
              auVar63._20_4_ = auVar49._20_4_ * 0.0;
              auVar63._24_4_ = auVar49._24_4_ * 0.0;
              auVar63._28_4_ = auVar88._28_4_;
              auVar56._4_4_ = auVar41._4_4_ * auVar51._4_4_;
              auVar56._0_4_ = auVar41._0_4_ * auVar51._0_4_;
              auVar56._8_4_ = auVar41._8_4_ * auVar51._8_4_;
              auVar56._12_4_ = auVar41._12_4_ * auVar51._12_4_;
              auVar56._16_4_ = auVar51._16_4_ * 0.0;
              auVar56._20_4_ = auVar51._20_4_ * 0.0;
              auVar56._24_4_ = auVar51._24_4_ * 0.0;
              auVar56._28_4_ = auVar51._28_4_;
              auVar94._0_4_ = auVar50._0_4_ * auVar37._0_4_;
              auVar94._4_4_ = auVar50._4_4_ * auVar37._4_4_;
              auVar94._8_4_ = auVar50._8_4_ * auVar37._8_4_;
              auVar94._12_4_ = auVar50._12_4_ * auVar37._12_4_;
              auVar94._16_4_ = auVar50._16_4_ * 0.0;
              auVar94._20_4_ = auVar50._20_4_ * 0.0;
              auVar94._24_4_ = auVar50._24_4_ * 0.0;
              auVar94._28_4_ = 0;
              auVar95 = ZEXT3264(auVar94);
              auVar60._4_4_ = auVar53._4_4_ * auVar38._4_4_;
              auVar60._0_4_ = auVar53._0_4_ * auVar38._0_4_;
              auVar60._8_4_ = auVar53._8_4_ * auVar38._8_4_;
              auVar60._12_4_ = auVar53._12_4_ * auVar38._12_4_;
              auVar60._16_4_ = auVar53._16_4_ * 0.0;
              auVar60._20_4_ = auVar53._20_4_ * 0.0;
              auVar60._24_4_ = auVar53._24_4_ * 0.0;
              auVar60._28_4_ = auVar53._28_4_;
              auVar16._4_4_ = auVar52._4_4_ * auVar37._4_4_;
              auVar16._0_4_ = auVar52._0_4_ * auVar37._0_4_;
              auVar16._8_4_ = auVar52._8_4_ * auVar37._8_4_;
              auVar16._12_4_ = auVar52._12_4_ * auVar37._12_4_;
              auVar16._16_4_ = auVar52._16_4_ * 0.0;
              auVar16._20_4_ = auVar52._20_4_ * 0.0;
              auVar16._24_4_ = auVar52._24_4_ * 0.0;
              auVar16._28_4_ = auVar52._28_4_;
              auVar17._4_4_ = auVar38._4_4_ * auVar64._4_4_;
              auVar17._0_4_ = auVar38._0_4_ * auVar64._0_4_;
              auVar17._8_4_ = auVar38._8_4_ * auVar64._8_4_;
              auVar17._12_4_ = auVar38._12_4_ * auVar64._12_4_;
              auVar17._16_4_ = auVar64._16_4_ * 0.0;
              auVar17._20_4_ = auVar64._20_4_ * 0.0;
              auVar17._24_4_ = auVar64._24_4_ * 0.0;
              auVar17._28_4_ = auVar64._28_4_;
              auVar49 = vpminsd_avx2(auVar94,auVar16);
              auVar51 = vpminsd_avx2(auVar60,auVar17);
              auVar49 = vmaxps_avx(auVar49,auVar51);
              auVar90 = ZEXT3264(auVar49);
              auVar53 = vpminsd_avx2(auVar63,auVar56);
              auVar50 = vpmaxsd_avx2(auVar63,auVar56);
              auVar51 = vpmaxsd_avx2(auVar94,auVar16);
              auVar52 = vpmaxsd_avx2(auVar60,auVar17);
              auVar51 = vminps_avx(auVar51,auVar52);
              auVar52 = vmaxps_avx512vl(auVar45,auVar53);
              auVar49 = vmaxps_avx(auVar52,auVar49);
              auVar50 = vminps_avx(auVar73._0_32_,auVar50);
              auVar51 = vminps_avx(auVar50,auVar51);
LAB_01c535c8:
              uVar35 = vcmpps_avx512vl(auVar49,auVar51,2);
            }
            else {
              auVar41 = vfmadd213ps_fma(pauVar27[uVar34 + 8],auVar62,pauVar27[uVar34 + 2]);
              auVar50 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar42,auVar46);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar27[8] + uVar32),auVar62,
                                        *(undefined1 (*) [32])(pauVar27[2] + uVar32));
              auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar27[8] + uVar31),auVar62,
                                        *(undefined1 (*) [32])(pauVar27[2] + uVar31));
              auVar49 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar43,auVar47);
              auVar51 = vfmadd213ps_avx512vl(ZEXT1632(auVar37),auVar44,auVar48);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar27[8] + uVar29),auVar62,
                                        *(undefined1 (*) [32])(pauVar27[2] + uVar29));
              auVar49 = vmaxps_avx(auVar49,auVar51);
              auVar52 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar42,auVar46);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar27[8] + (uVar32 ^ 0x20)),
                                        auVar62,*(undefined1 (*) [32])
                                                 (pauVar27[2] + (uVar32 ^ 0x20)));
              auVar51 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar43,auVar47);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar27[8] + (uVar31 ^ 0x20)),
                                        auVar62,*(undefined1 (*) [32])
                                                 (pauVar27[2] + (uVar31 ^ 0x20)));
              auVar53 = vfmadd213ps_avx512vl(ZEXT1632(auVar41),auVar44,auVar48);
              auVar90 = ZEXT3264(auVar53);
              auVar51 = vminps_avx(auVar51,auVar53);
              auVar50 = vmaxps_avx512vl(auVar45,auVar50);
              auVar49 = vmaxps_avx(auVar50,auVar49);
              auVar50 = vminps_avx(auVar73._0_32_,auVar52);
              auVar51 = vminps_avx(auVar50,auVar51);
              if (uVar24 != 6) goto LAB_01c535c8;
              uVar13 = vcmpps_avx512vl(auVar49,auVar51,2);
              uVar14 = vcmpps_avx512vl(auVar62,pauVar27[0xe],0xd);
              uVar35 = vcmpps_avx512vl(auVar62,pauVar27[0xf],1);
              uVar35 = uVar13 & uVar14 & uVar35;
            }
            bVar28 = (byte)uVar35;
            if (bVar28 == 0) goto LAB_01c534d4;
            auVar51 = *pauVar27;
            auVar50 = pauVar27[1];
            auVar52 = vmovdqa64_avx512vl(auVar98._0_32_);
            auVar52 = vpternlogd_avx512vl(auVar52,auVar49,auVar99._0_32_,0xf8);
            auVar53 = vpcompressd_avx512vl(auVar52);
            auVar54._0_4_ =
                 (uint)(bVar28 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar52._0_4_;
            bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar33 * auVar53._4_4_ | (uint)!bVar33 * auVar52._4_4_;
            bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar33 * auVar53._8_4_ | (uint)!bVar33 * auVar52._8_4_;
            bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
            auVar54._12_4_ = (uint)bVar33 * auVar53._12_4_ | (uint)!bVar33 * auVar52._12_4_;
            bVar33 = (bool)((byte)(uVar35 >> 4) & 1);
            auVar54._16_4_ = (uint)bVar33 * auVar53._16_4_ | (uint)!bVar33 * auVar52._16_4_;
            bVar33 = (bool)((byte)(uVar35 >> 5) & 1);
            auVar54._20_4_ = (uint)bVar33 * auVar53._20_4_ | (uint)!bVar33 * auVar52._20_4_;
            bVar33 = (bool)((byte)(uVar35 >> 6) & 1);
            auVar54._24_4_ = (uint)bVar33 * auVar53._24_4_ | (uint)!bVar33 * auVar52._24_4_;
            bVar33 = SUB81(uVar35 >> 7,0);
            auVar54._28_4_ = (uint)bVar33 * auVar53._28_4_ | (uint)!bVar33 * auVar52._28_4_;
            auVar52 = vpermt2q_avx512vl(auVar51,auVar54,auVar50);
            auVar90 = ZEXT3264(auVar52);
            uVar35 = auVar52._0_8_;
            bVar28 = bVar28 - 1 & bVar28;
          } while (bVar28 == 0);
          auVar62 = vpshufd_avx2(auVar54,0x55);
          vpermt2q_avx512vl(auVar51,auVar62,auVar50);
          auVar61 = vpminsd_avx2(auVar54,auVar62);
          auVar62 = vpmaxsd_avx2(auVar54,auVar62);
          bVar28 = bVar28 - 1 & bVar28;
          if (bVar28 == 0) {
            auVar61 = vpermi2q_avx512vl(auVar61,auVar51,auVar50);
            uVar35 = auVar61._0_8_;
            auVar61 = vpermt2q_avx512vl(auVar51,auVar62,auVar50);
            (pSVar30->ptr).ptr = auVar61._0_8_;
            lVar25 = 8;
            lStack_2580 = 0x10;
LAB_01c538b5:
            auVar49 = vpermd_avx2(auVar62,auVar49);
            *(int *)((long)&(pSVar30->ptr).ptr + lVar25) = auVar49._0_4_;
            pSVar30 = (StackItemT<embree::NodeRefPtr<8>_> *)
                      ((long)&(pSVar30->ptr).ptr + lStack_2580);
            goto LAB_01c534f0;
          }
          auVar53 = vpshufd_avx2(auVar54,0xaa);
          vpermt2q_avx512vl(auVar51,auVar53,auVar50);
          auVar52 = vpminsd_avx2(auVar61,auVar53);
          auVar61 = vpmaxsd_avx2(auVar61,auVar53);
          auVar53 = vpminsd_avx2(auVar62,auVar61);
          auVar61 = vpmaxsd_avx2(auVar62,auVar61);
          bVar28 = bVar28 - 1 & bVar28;
          if (bVar28 == 0) {
            auVar62 = vpermi2q_avx512vl(auVar52,auVar51,auVar50);
            auVar90 = ZEXT3264(auVar62);
            uVar35 = auVar62._0_8_;
            auVar62 = vpermt2q_avx512vl(auVar51,auVar61,auVar50);
            (pSVar30->ptr).ptr = auVar62._0_8_;
            auVar62 = vpermd_avx2(auVar61,auVar49);
            pSVar30->dist = auVar62._0_4_;
            auVar62 = vpermt2q_avx512vl(auVar51,auVar53,auVar50);
            pSVar30[1].ptr.ptr = auVar62._0_8_;
            lStack_2580 = 0x18;
            lVar25 = lStack_2580;
            lStack_2580 = 0x20;
            auVar62 = auVar53;
            goto LAB_01c538b5;
          }
          auVar62 = vpshufd_avx2(auVar54,0xff);
          vpermt2q_avx512vl(auVar51,auVar62,auVar50);
          auVar64 = vpminsd_avx2(auVar52,auVar62);
          auVar52 = vpmaxsd_avx2(auVar52,auVar62);
          auVar62 = vpminsd_avx2(auVar53,auVar52);
          auVar52 = vpmaxsd_avx2(auVar53,auVar52);
          auVar53 = vpminsd_avx2(auVar61,auVar52);
          auVar90 = ZEXT3264(auVar53);
          auVar61 = vpmaxsd_avx2(auVar61,auVar52);
          bVar28 = bVar28 - 1 & bVar28;
          if (bVar28 == 0) {
            auVar52 = vpermi2q_avx512vl(auVar64,auVar51,auVar50);
            auVar95 = ZEXT3264(auVar52);
            uVar35 = auVar52._0_8_;
            auVar52 = vpermt2q_avx512vl(auVar51,auVar61,auVar50);
            (pSVar30->ptr).ptr = auVar52._0_8_;
            auVar61 = vpermd_avx2(auVar61,auVar49);
            pSVar30->dist = auVar61._0_4_;
            auVar61 = vpermt2q_avx512vl(auVar51,auVar53,auVar50);
            pSVar30[1].ptr.ptr = auVar61._0_8_;
            auVar61 = vpermd_avx2(auVar53,auVar49);
            pSVar30[1].dist = auVar61._0_4_;
            auVar61 = vpermt2q_avx512vl(auVar51,auVar62,auVar50);
            pSVar30[2].ptr.ptr = auVar61._0_8_;
            lVar25 = 0x28;
            lStack_2580 = 0x30;
            goto LAB_01c538b5;
          }
          auVar63 = valignd_avx512vl(auVar54,auVar54,3);
          auVar52 = vpmovsxbd_avx2(ZEXT816(0x303020108));
          auVar64 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar52,auVar64);
          auVar52 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar95 = ZEXT3264(auVar52);
          auVar62 = vpermt2d_avx512vl(auVar64,auVar52,auVar62);
          auVar52 = vpermt2d_avx512vl(auVar62,auVar52,auVar53);
          auVar62 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar62 = vpermt2d_avx512vl(auVar52,auVar62,auVar61);
          auVar82 = ZEXT3264(auVar62);
          bVar26 = bVar28;
          do {
            auVar52 = auVar82._0_32_;
            auVar81._8_4_ = 1;
            auVar81._0_8_ = 0x100000001;
            auVar81._12_4_ = 1;
            auVar81._16_4_ = 1;
            auVar81._20_4_ = 1;
            auVar81._24_4_ = 1;
            auVar81._28_4_ = 1;
            auVar62 = vpermd_avx2(auVar81,auVar63);
            auVar63 = valignd_avx512vl(auVar63,auVar63,1);
            auVar61 = vpermt2q_avx512vl(auVar51,auVar63,auVar50);
            auVar90 = ZEXT3264(auVar61);
            bVar26 = bVar26 - 1 & bVar26;
            uVar12 = vpcmpd_avx512vl(auVar62,auVar52,5);
            auVar62 = vpmaxsd_avx2(auVar62,auVar52);
            bVar15 = (byte)uVar12 << 1;
            auVar61 = valignd_avx512vl(auVar52,auVar52,7);
            bVar33 = (bool)((byte)uVar12 & 1);
            bVar7 = (bool)(bVar15 >> 2 & 1);
            bVar8 = (bool)(bVar15 >> 3 & 1);
            bVar9 = (bool)(bVar15 >> 4 & 1);
            bVar10 = (bool)(bVar15 >> 5 & 1);
            bVar11 = (bool)(bVar15 >> 6 & 1);
            auVar82 = ZEXT3264(CONCAT428((uint)(bVar15 >> 7) * auVar61._28_4_ |
                                         (uint)!(bool)(bVar15 >> 7) * auVar62._28_4_,
                                         CONCAT424((uint)bVar11 * auVar61._24_4_ |
                                                   (uint)!bVar11 * auVar62._24_4_,
                                                   CONCAT420((uint)bVar10 * auVar61._20_4_ |
                                                             (uint)!bVar10 * auVar62._20_4_,
                                                             CONCAT416((uint)bVar9 * auVar61._16_4_
                                                                       | (uint)!bVar9 *
                                                                         auVar62._16_4_,
                                                                       CONCAT412((uint)bVar8 *
                                                                                 auVar61._12_4_ |
                                                                                 (uint)!bVar8 *
                                                                                 auVar62._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar7 * auVar61._8_4_ |
                                                  (uint)!bVar7 * auVar62._8_4_,
                                                  CONCAT44((uint)bVar33 * auVar61._4_4_ |
                                                           (uint)!bVar33 * auVar62._4_4_,
                                                           auVar62._0_4_))))))));
          } while (bVar26 != 0);
          lVar25 = (ulong)(uint)POPCOUNT((uint)bVar28) + 3;
          while( true ) {
            auVar61 = auVar82._0_32_;
            auVar62 = vpermt2q_avx512vl(auVar51,auVar61,auVar50);
            uVar35 = auVar62._0_8_;
            bVar33 = lVar25 == 0;
            lVar25 = lVar25 + -1;
            if (bVar33) break;
            (pSVar30->ptr).ptr = uVar35;
            auVar62 = vpermd_avx2(auVar61,auVar49);
            pSVar30->dist = auVar62._0_4_;
            auVar62 = valignd_avx512vl(auVar61,auVar61,1);
            auVar82 = ZEXT3264(auVar62);
            pSVar30 = pSVar30 + 1;
          }
        } while( true );
      }
      goto LAB_01c534d4;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }